

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s *
fio_str_concat(fio_str_info_s *__return_storage_ptr__,fio_str_s *dest,fio_str_s *src)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 local_30 [8];
  fio_str_info_s src_state;
  fio_str_s *src_local;
  fio_str_s *dest_local;
  
  src_state.data = (char *)src;
  if (((dest == (fio_str_s *)0x0) || (src == (fio_str_s *)0x0)) || (dest->frozen != '\0')) {
    fio_str_info(__return_storage_ptr__,dest);
  }
  else {
    fio_str_info((fio_str_info_s *)local_30,src);
    sVar1 = src_state.capa;
    if (src_state.capa == 0) {
      fio_str_info(__return_storage_ptr__,dest);
    }
    else {
      sVar2 = fio_str_len(dest);
      fio_str_resize(__return_storage_ptr__,dest,sVar1 + sVar2);
      memcpy(__return_storage_ptr__->data + (__return_storage_ptr__->len - src_state.capa),
             (void *)src_state.len,src_state.capa);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_concat(fio_str_s *dest,
                                              fio_str_s const *src) {
  if (!dest || !src || dest->frozen)
    return fio_str_info(dest);
  fio_str_info_s src_state = fio_str_info(src);
  if (!src_state.len)
    return fio_str_info(dest);
  fio_str_info_s state =
      fio_str_resize(dest, src_state.len + fio_str_len(dest));
  memcpy(state.data + state.len - src_state.len, src_state.data, src_state.len);
  return state;
}